

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O0

void ExchCXX::detail::host_eval_exc_helper_unpolar<ExchCXX::BuiltinEPC17_1>
               (int N,const_host_buffer_type rho,host_buffer_type eps)

{
  int in_EDI;
  int32_t i;
  double *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar1;
  
  for (iVar1 = 0; iVar1 < in_EDI; iVar1 = iVar1 + 1) {
    lda_screening_interface<ExchCXX::BuiltinEPC17_1>::eval_exc_unpolar
              ((double)CONCAT44(iVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

LDA_EXC_GENERATOR( host_eval_exc_helper_unpolar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    traits::eval_exc_unpolar( rho[i], eps[i] );

  }

}